

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExtraEclipseCDT4Generator.cxx
# Opt level: O1

void __thiscall
cmExtraEclipseCDT4Generator::CreateLinksForTargets
          (cmExtraEclipseCDT4Generator *this,cmXMLWriter *xml)

{
  cmGlobalGenerator *pcVar1;
  cmLocalGenerator *pcVar2;
  cmGeneratorTarget *this_00;
  cmSourceFile *this_01;
  pointer ppcVar3;
  TargetType TVar4;
  string *psVar5;
  cmSourceGroup *this_02;
  pointer ppcVar6;
  pointer ppcVar7;
  pointer ppcVar8;
  string linkName2;
  vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> files;
  string linkName;
  vector<cmSourceGroup,_std::allocator<cmSourceGroup>_> sourceGroups;
  string local_f8;
  string local_d8;
  vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> local_b8;
  cmMakefile *local_a0;
  string local_98;
  pointer local_78;
  pointer local_70;
  cmExtraEclipseCDT4Generator *local_68;
  cmXMLWriter *local_60;
  vector<cmSourceGroup,_std::allocator<cmSourceGroup>_> *local_58;
  pointer local_50;
  vector<cmSourceGroup,_std::allocator<cmSourceGroup>_> local_48;
  
  local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"[Targets]","");
  local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"virtual:/virtual","");
  AppendLinkedResource(xml,&local_98,&local_d8,VirtualFolder);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
    operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
  }
  pcVar1 = (this->super_cmExternalMakefileProjectGenerator).GlobalGenerator;
  ppcVar6 = (pcVar1->LocalGenerators).
            super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  local_78 = (pcVar1->LocalGenerators).
             super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>._M_impl.
             super__Vector_impl_data._M_finish;
  if (ppcVar6 != local_78) {
    local_68 = this;
    local_60 = xml;
    do {
      pcVar2 = *ppcVar6;
      ppcVar8 = (pcVar2->GeneratorTargets).
                super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
      local_50 = (pcVar2->GeneratorTargets).
                 super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
      local_70 = ppcVar6;
      if (ppcVar8 != local_50) {
        local_a0 = pcVar2->Makefile;
        local_58 = &local_a0->SourceGroups;
        do {
          this_00 = *ppcVar8;
          local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_d8,local_98._M_dataplus._M_p,
                     local_98._M_dataplus._M_p + local_98._M_string_length);
          std::__cxx11::string::append((char *)&local_d8);
          TVar4 = cmGeneratorTarget::GetType(this_00);
          if (TVar4 < UTILITY) {
            cmGeneratorTarget::GetType(this_00);
            std::__cxx11::string::append((char *)&local_d8);
            psVar5 = cmGeneratorTarget::GetName_abi_cxx11_(this_00);
            std::__cxx11::string::_M_append((char *)&local_d8,(ulong)(psVar5->_M_dataplus)._M_p);
            local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_f8,"virtual:/virtual","");
            AppendLinkedResource(xml,&local_d8,&local_f8,VirtualFolder);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
              operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
            }
            if (this->GenerateLinkedResources != false) {
              std::vector<cmSourceGroup,_std::allocator<cmSourceGroup>_>::vector(&local_48,local_58)
              ;
              local_b8.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
              super__Vector_impl_data._M_start = (pointer)0x0;
              local_b8.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
              super__Vector_impl_data._M_finish = (pointer)0x0;
              local_b8.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_f8,"CMAKE_BUILD_TYPE","");
              psVar5 = cmMakefile::GetSafeDefinition(local_a0,&local_f8);
              cmGeneratorTarget::GetSourceFiles(this_00,&local_b8,psVar5);
              ppcVar7 = local_b8.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              ppcVar3 = local_b8.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>
                        ._M_impl.super__Vector_impl_data._M_finish;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
                operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1
                               );
                ppcVar7 = local_b8.
                          super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                          _M_impl.super__Vector_impl_data._M_start;
                ppcVar3 = local_b8.
                          super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                          _M_impl.super__Vector_impl_data._M_finish;
              }
              for (; xml = local_60, this = local_68, ppcVar7 != ppcVar3; ppcVar7 = ppcVar7 + 1) {
                this_01 = *ppcVar7;
                psVar5 = cmSourceFile::GetFullPath(this_01,(string *)0x0);
                this_02 = cmMakefile::FindSourceGroup(local_a0,psVar5,&local_48);
                cmSourceGroup::AssignSource(this_02,this_01);
              }
              WriteGroups(local_68,&local_48,&local_d8,local_60);
              if (local_b8.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                  _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                operator_delete(local_b8.
                                super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                                _M_impl.super__Vector_impl_data._M_start,
                                (long)local_b8.
                                      super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                (long)local_b8.
                                      super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>
                                      ._M_impl.super__Vector_impl_data._M_start);
              }
              std::vector<cmSourceGroup,_std::allocator<cmSourceGroup>_>::~vector(&local_48);
            }
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
            operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
          }
          ppcVar8 = ppcVar8 + 1;
        } while (ppcVar8 != local_50);
      }
      ppcVar6 = local_70 + 1;
    } while (ppcVar6 != local_78);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void cmExtraEclipseCDT4Generator::CreateLinksForTargets(cmXMLWriter& xml)
{
  std::string linkName = "[Targets]";
  cmExtraEclipseCDT4Generator::AppendLinkedResource(
    xml, linkName, "virtual:/virtual", VirtualFolder);

  for (cmLocalGenerator* lg : this->GlobalGenerator->GetLocalGenerators()) {
    cmMakefile* makefile = lg->GetMakefile();
    const std::vector<cmGeneratorTarget*>& targets = lg->GetGeneratorTargets();

    for (cmGeneratorTarget* target : targets) {
      std::string linkName2 = linkName;
      linkName2 += "/";
      switch (target->GetType()) {
        case cmStateEnums::EXECUTABLE:
        case cmStateEnums::STATIC_LIBRARY:
        case cmStateEnums::SHARED_LIBRARY:
        case cmStateEnums::MODULE_LIBRARY:
        case cmStateEnums::OBJECT_LIBRARY: {
          const char* prefix =
            (target->GetType() == cmStateEnums::EXECUTABLE ? "[exe] "
                                                           : "[lib] ");
          linkName2 += prefix;
          linkName2 += target->GetName();
          cmExtraEclipseCDT4Generator::AppendLinkedResource(
            xml, linkName2, "virtual:/virtual", VirtualFolder);
          if (!this->GenerateLinkedResources) {
            break; // skip generating the linked resources to the source files
          }
          std::vector<cmSourceGroup> sourceGroups =
            makefile->GetSourceGroups();
          // get the files from the source lists then add them to the groups
          cmGeneratorTarget* gt = const_cast<cmGeneratorTarget*>(target);
          std::vector<cmSourceFile*> files;
          gt->GetSourceFiles(files,
                             makefile->GetSafeDefinition("CMAKE_BUILD_TYPE"));
          for (cmSourceFile* sf : files) {
            // Add the file to the list of sources.
            std::string const& source = sf->GetFullPath();
            cmSourceGroup* sourceGroup =
              makefile->FindSourceGroup(source, sourceGroups);
            sourceGroup->AssignSource(sf);
          }

          this->WriteGroups(sourceGroups, linkName2, xml);
        } break;
        // ignore all others:
        default:
          break;
      }
    }
  }
}